

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

void writeAltFmtXV(FILE *outf,int showBegin,int showEnd,char *groupname,dotNode *(*results) [7],
                  int spike)

{
  char *pcVar1;
  undefined8 local_88;
  char *mast [7];
  char *local_48;
  char *color;
  dotNode *node;
  int local_30;
  int j;
  int i;
  int spike_local;
  dotNode *(*results_local) [7];
  char *groupname_local;
  int showEnd_local;
  int showBegin_local;
  FILE *outf_local;
  
  local_48 = "";
  memcpy(&local_88,&PTR_anon_var_dwarf_e9d6_00154d10,0x38);
  if (showBegin == 0) {
    fprintf((FILE *)outf,"#  group: %s\n",groupname);
  }
  else if (showEnd == 0) {
    fprintf((FILE *)outf,"# begin object\n#  group: %s\n",groupname);
  }
  else {
    fprintf((FILE *)outf,"# begin %s\n",groupname);
  }
  for (node._4_4_ = 0; node._4_4_ < 7; node._4_4_ = node._4_4_ + 1) {
    for (local_30 = 0; local_30 < 0x72; local_30 = local_30 + 1) {
      color = (char *)results[local_30][node._4_4_];
      if ((dotNode *)color != (dotNode *)0x0) {
        pcVar1 = getAtomName(local_30);
        fprintf((FILE *)outf,"#  (%s %s)\n",pcVar1,mast[(long)node._4_4_ + -1]);
        pcVar1 = getColor(local_30);
        local_48 = convertKinColorToXV(pcVar1);
      }
      for (; color != (char *)0x0; color = *(char **)color) {
        if (ColorGap != 0) {
          if (*(long *)(color + 0x10) == 0) {
            local_48 = "124";
          }
          else {
            local_48 = assignGapColorForXV(*(float *)(color + 0x4c),node._4_4_);
          }
        }
        if ((((node._4_4_ == 3) || (node._4_4_ == 4)) || (node._4_4_ == 5)) && (spike != 0)) {
          fprintf((FILE *)outf,"%.3f %.3f %.3f %.3f %.3f %.3f %s\n",*(undefined8 *)(color + 0x18),
                  *(undefined8 *)(color + 0x20),*(undefined8 *)(color + 0x28),
                  *(undefined8 *)(color + 0x30),*(undefined8 *)(color + 0x38),
                  *(undefined8 *)(color + 0x40),local_48);
        }
        else {
          fprintf((FILE *)outf,"%.3f %.3f %.3f %.3f %.3f %.3f %s\n",*(undefined8 *)(color + 0x18),
                  *(undefined8 *)(color + 0x20),*(undefined8 *)(color + 0x28),
                  *(undefined8 *)(color + 0x18),*(undefined8 *)(color + 0x20),
                  *(undefined8 *)(color + 0x28),local_48);
        }
      }
    }
  }
  if (showEnd == 0) {
    fprintf((FILE *)outf,"#  endgroup: %s\n",groupname);
  }
  else if (showBegin == 0) {
    fprintf((FILE *)outf,"#  endgroup: %s\n# end object\n",groupname);
  }
  else {
    fprintf((FILE *)outf,"# end %s\n",groupname);
  }
  return;
}

Assistant:

void writeAltFmtXV(FILE *outf, int showBegin, int showEnd,
      char* groupname, dotNode *results[][NODEWIDTH], int spike)
{
   int i, j;
   dotNode *node;
   char *color = "";
   //Old: char *mast[NODEWIDTH] = {"wide contact", "close contact", "small overlap", "bad overlap", "H-bonds"};
    /* 04/15/2015 SJ changed to reflect new NODEWIDTH, see probe.h*/
   char *mast[NODEWIDTH] = {"wide contact", "close contact", "weak H-bonds", "small overlap", "bad overlap", "worse overlap", "H-bonds"};
    
   if (showBegin) {
      if (showEnd) { fprintf(outf, "# begin %s\n", groupname); }
      else         { fprintf(outf, "# begin object\n#  group: %s\n", groupname); }
   }
   else            { fprintf(outf, "#  group: %s\n", groupname); }

   for (j = 0; j < NODEWIDTH; j++) {
      for (i = 0; i < NUMATOMTYPES; i++) {
	 node = results[i][j];
	 if (node) {
	    fprintf(outf, "#  (%s %s)\n", getAtomName(i), mast[j]);
	    color = convertKinColorToXV(getColor(i));
	 }
	 while(node) {
	    if (ColorGap) {
	       if (node->t) {
		  color = assignGapColorForXV(node->gap, j);
	       }
	       else { color = "124";}
	    }
	    if ((j == 3 || j == 4 || j == 5) && spike) {/* bump */ /* 04/15/2015 SJ changed j numbers to match new ones for so, bo, and wo*/
	       fprintf(outf,
		  "%.3f %.3f %.3f %.3f %.3f %.3f %s\n",
		  node->loc.x, node->loc.y, node->loc.z,
		  node->spike.x, node->spike.y, node->spike.z, color);
	    }
	    else {/* contact or H-bond */
	       fprintf(outf, "%.3f %.3f %.3f %.3f %.3f %.3f %s\n",
		  node->loc.x, node->loc.y, node->loc.z,
		  node->loc.x, node->loc.y, node->loc.z, color);
	    }
	    node = node->next;
	 }
      }
   }
   if (showEnd) {
      if (showBegin) { fprintf(outf, "# end %s\n", groupname); }
      else           { fprintf(outf, "#  endgroup: %s\n# end object\n", groupname); }
   }
   else              { fprintf(outf, "#  endgroup: %s\n", groupname); }
}